

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O0

int xmlPatternFromRoot(xmlPatternPtr comp)

{
  xmlPatternPtr local_18;
  xmlPatternPtr comp_local;
  
  local_18 = comp;
  if (comp == (xmlPatternPtr)0x0) {
    comp_local._4_4_ = -1;
  }
  else {
    for (; local_18 != (xmlPatternPtr)0x0; local_18 = local_18->next) {
      if (local_18->stream == (xmlStreamCompPtr)0x0) {
        return -1;
      }
      if ((local_18->flags & 0x100U) != 0) {
        return 1;
      }
    }
    comp_local._4_4_ = 0;
  }
  return comp_local._4_4_;
}

Assistant:

int
xmlPatternFromRoot(xmlPatternPtr comp) {
    if (comp == NULL)
        return(-1);
    while (comp != NULL) {
        if (comp->stream == NULL)
	    return(-1);
	if (comp->flags & PAT_FROM_ROOT)
	    return(1);
	comp = comp->next;
    }
    return(0);

}